

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yyrefill(GREG *G)

{
  int iVar1;
  PVIPParserStringState *pPVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  
  iVar3 = G->buflen;
  iVar1 = G->pos;
  iVar5 = iVar3 - iVar1;
  while (iVar5 < 0x200) {
    G->buflen = iVar3 * 2;
    pcVar4 = (char *)realloc(G->buf,(long)(iVar3 * 2));
    G->buf = pcVar4;
    iVar3 = G->buflen;
    iVar1 = G->pos;
    iVar5 = iVar3 - iVar1;
  }
  pcVar4 = G->buf;
  if ((G->data).is_string == 0) {
    iVar3 = fgetc((FILE *)(G->data).fp);
    pcVar4[iVar1] = (char)iVar3;
    bVar6 = (char)iVar3 != -1;
  }
  else {
    pPVar2 = (G->data).str;
    if (pPVar2->len == pPVar2->pos) {
      bVar6 = false;
    }
    else {
      pcVar4[iVar1] = pPVar2->buf[pPVar2->pos];
      pPVar2->pos = pPVar2->pos + 1;
      bVar6 = true;
    }
  }
  if (bVar6 != false) {
    G->limit = G->limit + (uint)bVar6;
  }
  return (uint)(bVar6 != false);
}

Assistant:

YY_LOCAL(int) yyrefill(GREG *G)
{
  int yyn;
  while (G->buflen - G->pos < 512)
    {
      G->buflen *= 2;
      G->buf= (char*)YY_REALLOC(G->buf, G->buflen, G->data);
    }
  YY_INPUT((G->buf + G->pos), yyn, (G->buflen - G->pos), G->data);
  if (!yyn) return 0;
  G->limit += yyn;
  return 1;
}